

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::get_image_dimensions_query_size
               (Impl *impl,Builder *builder,Id image_id,uint32_t *num_coords)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  Id typeId;
  Dim DVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  char buffer [4096];
  
  typeId = Converter::Impl::get_type_id(impl,image_id);
  DVar4 = spv::Builder::getTypeDimensionality(builder,typeId);
  bVar2 = spv::Builder::isArrayedImageType(builder,typeId);
  if ((DVar4 < DimSubpassData) && ((0x2fU >> (DVar4 & 0x1f) & 1) != 0)) {
    uVar1 = *(uint32_t *)(&DAT_001a55b4 + (ulong)DVar4 * 4);
    *num_coords = *(uint32_t *)(&DAT_001a559c + (ulong)DVar4 * 4);
    bVar3 = true;
    if (bVar2) {
      *num_coords = uVar1;
    }
  }
  else {
    p_Var5 = get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unexpected sample dimensionality.\n",0x2b,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer,"Unexpected sample dimensionality.\n",0x23);
      pvVar6 = get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,buffer);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool get_image_dimensions_query_size(Converter::Impl &impl, spv::Builder &builder, spv::Id image_id,
                                     uint32_t *num_coords)
{
	spv::Id image_type_id = impl.get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool is_array = builder.isArrayedImageType(image_type_id);

	switch (dim)
	{
	case spv::Dim1D:
	case spv::DimBuffer:
		*num_coords = 1;
		break;

	case spv::Dim2D:
	case spv::DimCube:
		*num_coords = 2;
		break;

	case spv::Dim3D:
		*num_coords = 3;
		break;

	default:
		LOGE("Unexpected sample dimensionality.\n");
		return false;
	}

	if (is_array)
		(*num_coords)++;

	return true;
}